

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

int cmsys::SystemTools::GetTerminalWidth(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  string columns;
  char *endptr;
  winsize ws;
  
  columns._M_dataplus._M_p = (pointer)&columns.field_2;
  columns._M_string_length = 0;
  columns.field_2._M_local_buf[0] = '\0';
  iVar2 = ioctl(1,0x5413,&ws);
  uVar5 = -(uint)(ws.ws_row == 0) | (uint)ws.ws_col | -(uint)(ws.ws_col == 0);
  if (iVar2 == -1) {
    uVar5 = 0xffffffff;
  }
  iVar2 = isatty(1);
  bVar1 = GetEnv("COLUMNS",&columns);
  uVar5 = -(uint)(iVar2 == 0) | uVar5;
  if (bVar1 && columns._M_string_length != 0) {
    lVar3 = strtol(columns._M_dataplus._M_p,&endptr,0);
    if (endptr != (char *)0x0) {
      uVar4 = uVar5;
      if (lVar3 - 1U < 999) {
        uVar4 = (uint)lVar3;
      }
      if (*endptr == '\0') {
        uVar5 = uVar4;
      }
    }
  }
  uVar4 = 0xffffffff;
  if (8 < (int)uVar5) {
    uVar4 = uVar5;
  }
  std::__cxx11::string::~string((string *)&columns);
  return uVar4;
}

Assistant:

static time_t windows_filetime_to_posix_time(const FILETIME& ft)
{
  LARGE_INTEGER date;
  date.HighPart = ft.dwHighDateTime;
  date.LowPart = ft.dwLowDateTime;

  // removes the diff between 1970 and 1601
  date.QuadPart -= ((LONGLONG)(369 * 365 + 89) * 24 * 3600 * 10000000);

  // converts back from 100-nanoseconds to seconds
  return date.QuadPart / 10000000;
}